

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseInfix
          (Parser *this,AST *lhs,Token *begin,uint max_precedence)

{
  pointer *ppFVar1;
  uint uVar2;
  _List_node_base *p_Var3;
  Allocator *pAVar4;
  pointer pcVar5;
  unsigned_long uVar6;
  bool bVar7;
  int iVar8;
  iterator iVar9;
  AST *pAVar10;
  StaticError *pSVar11;
  bool bVar12;
  uint *puVar13;
  string *psVar14;
  Fodder *this_00;
  uint max_precedence_00;
  bool is_slice;
  AST *lhs_local;
  BinaryOp bop;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f0;
  Location *local_3e8;
  Token *local_3e0;
  Location *local_3d8;
  AST *first;
  Token end;
  Fodder second_fodder;
  AST *rhs;
  undefined1 local_2e0 [8];
  undefined1 local_2d8 [96];
  undefined1 local_278 [80];
  AST *obj;
  AST *pAStack_220;
  undefined1 local_218 [32];
  AST *third;
  undefined4 local_1ec;
  _Alloc_hider local_1e8;
  AST *second;
  Fodder third_fodder;
  Token op;
  
  ppFVar1 = &end.fodder.
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_3e8 = &(begin->location).begin;
  local_3f0 = &end.location.file.field_2;
  local_1e8._M_p = local_278 + 0x20;
  local_3d8 = &end.location.end;
  lhs_local = lhs;
  local_3e0 = begin;
  local_1ec = max_precedence;
  do {
    bop = BOP_PLUS;
    p_Var3 = (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    uVar2 = *(uint *)&p_Var3[1]._M_next;
    if (0x1c < uVar2) {
LAB_001a0863:
      local_218._24_8_ = lhs_local;
      bVar12 = false;
      goto LAB_001a1652;
    }
    max_precedence_00 = 2;
    if ((0xc5U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((((0x10001000U >> (uVar2 & 0x1f) & 1) == 0) ||
          (iVar8 = std::__cxx11::string::compare((char *)(p_Var3 + 3)), iVar8 == 0)) ||
         (iVar8 = std::__cxx11::string::compare
                            ((char *)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next + 3)),
         iVar8 == 0)) goto LAB_001a0863;
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::BinaryOp>_>_>
                      *)(anonymous_namespace)::binary_map_abi_cxx11_,
                     (key_type *)
                     ((this->tokens->
                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                      )._M_impl._M_node.super__List_node_base._M_next + 3));
      if (iVar9._M_node == (_Base_ptr)((anonymous_namespace)::binary_map_abi_cxx11_ + 8)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&op);
        ppFVar1 = &op.fodder.
                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppFVar1,"not a binary operator: ",0x17);
        p_Var3 = (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppFVar1,(char *)p_Var3[3]._M_next,
                   (long)*(_List_node_base **)((long)(p_Var3 + 3) + 8));
        pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
        p_Var3 = (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar11,(LocationRange *)(p_Var3 + 9),(string *)&end);
        __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
      }
      bop = iVar9._M_node[2]._M_color;
      puVar13 = (uint *)std::
                        map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
                        ::operator[]((map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
                                      *)(anonymous_namespace)::precedence_map,&bop);
      max_precedence_00 = *puVar13;
    }
    if ((uint)local_1ec <= max_precedence_00) goto LAB_001a0863;
    Token::Token(&op,(Token *)((this->tokens->
                               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                               )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
    _M_erase(this->tokens,
             (this->tokens->
             super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
             _M_impl._M_node.super__List_node_base._M_next);
    puVar13 = &switchD_001a06a9::switchdataD_0024b3cc;
    switch(op.kind) {
    case BRACE_L:
      parseObjectRemainder(&end,this,&obj,&op);
      pAVar4 = this->alloc;
      pcVar5 = (local_3e0->location).file._M_dataplus._M_p;
      rhs = (AST *)local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rhs,pcVar5,pcVar5 + (local_3e0->location).file._M_string_length);
      local_2d8._16_8_ = local_3e8->line;
      local_2d8._24_8_ = local_3e8->column;
      local_2d8._32_8_ = local_3d8->line;
      local_2d8._40_8_ = local_3d8->column;
      lhs_local = &Allocator::
                   make<jsonnet::internal::ApplyBrace,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,jsonnet::internal::AST*&>
                             (pAVar4,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&obj)->super_AST;
      if (rhs != (AST *)local_2d8) {
        operator_delete(rhs,CONCAT35(local_2d8._5_3_,local_2d8._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.location.file._M_dataplus._M_p != local_3f0) {
        operator_delete(end.location.file._M_dataplus._M_p,
                        end.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockTermIndent._M_dataplus._M_p != &end.stringBlockTermIndent.field_2) {
        operator_delete(end.stringBlockTermIndent._M_dataplus._M_p,
                        end.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockIndent._M_dataplus._M_p != &end.stringBlockIndent.field_2) {
        operator_delete(end.stringBlockIndent._M_dataplus._M_p,
                        end.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.data._M_dataplus._M_p != &end.data.field_2) {
        operator_delete(end.data._M_dataplus._M_p,end.data.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001a0c43;
    case BRACE_R:
    case BRACKET_R:
    case COMMA:
    case DOLLAR:
switchD_001a06a9_caseD_1:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Should not be here.",0x13);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      abort();
    case BRACKET_L:
      first = (AST *)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      second = (AST *)0x0;
      third_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      third_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      third_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      third = (AST *)0x0;
      p_Var3 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (*(int *)&p_Var3[1]._M_next == 3) {
        pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
        pop(&end,this);
        rhs = (AST *)local_2d8;
        local_2d8._0_5_ = 0x6973726170;
        local_2d8._5_3_ = 0x20676e;
        local_2d8._8_5_ = 0x7865646e69;
        local_2e0 = (undefined1  [8])0xd;
        local_2d8[0xd] = '\0';
        unexpected(pSVar11,(Parser *)&end,(Token *)&rhs,(string *)puVar13);
        __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
      }
      iVar8 = std::__cxx11::string::compare((char *)(p_Var3 + 3));
      if ((iVar8 != 0) &&
         (iVar8 = std::__cxx11::string::compare
                            ((char *)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next + 3)),
         iVar8 != 0)) {
        first = parse(this,0xf);
      }
      p_Var3 = (this->tokens->
               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if ((*(int *)&p_Var3[1]._M_next == 0xc) &&
         (iVar8 = std::__cxx11::string::compare((char *)(p_Var3 + 3)), iVar8 == 0)) {
        is_slice = true;
        Token::Token(&end,(Token *)((this->tokens->
                                    super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                    )._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&second_fodder,&end.fodder);
        if (*(int *)&(this->tokens->
                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                     )._M_impl._M_node.super__List_node_base._M_next[1]._M_next != 3) {
          third = parse(this,0xf);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)end.location.file._M_dataplus._M_p != local_3f0) {
          operator_delete(end.location.file._M_dataplus._M_p,
                          end.location.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)end.stringBlockTermIndent._M_dataplus._M_p != &end.stringBlockTermIndent.field_2) {
          operator_delete(end.stringBlockTermIndent._M_dataplus._M_p,
                          end.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)end.stringBlockIndent._M_dataplus._M_p != &end.stringBlockIndent.field_2) {
          operator_delete(end.stringBlockIndent._M_dataplus._M_p,
                          end.stringBlockIndent.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)end.data._M_dataplus._M_p != &end.data.field_2) {
          operator_delete(end.data._M_dataplus._M_p,end.data.field_2._M_allocated_capacity + 1);
        }
LAB_001a141e:
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&end.fodder);
      }
      else {
        psVar14 = (string *)
                  (this->tokens->
                  super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        if (*(int *)&psVar14->field_2 != 3) {
          is_slice = true;
          Token::Token(&end,(Token *)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next + 1));
          std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
          _M_erase(this->tokens,
                   (this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next);
          iVar8 = std::__cxx11::string::compare((char *)&end.data);
          if (iVar8 != 0) {
            pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
            local_2d8._0_5_ = 0x6973726170;
            local_2d8._5_3_ = 0x20676e;
            local_2d8._8_5_ = 0x6563696c73;
            local_2e0 = (undefined1  [8])0xd;
            local_2d8[0xd] = '\0';
            rhs = (AST *)local_2d8;
            unexpected(pSVar11,(Parser *)&end,(Token *)&rhs,psVar14);
            __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
          }
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&second_fodder,&end.fodder);
          iVar8 = std::__cxx11::string::compare
                            ((char *)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next + 3));
          if ((iVar8 != 0) &&
             (*(int *)&(this->tokens->
                       super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                       )._M_impl._M_node.super__List_node_base._M_next[1]._M_next != 3)) {
            second = parse(this,0xf);
          }
          psVar14 = (string *)
                    (this->tokens->
                    super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                    )._M_impl._M_node.super__List_node_base._M_next;
          if (*(int *)&psVar14->field_2 != 3) {
            Token::Token((Token *)&rhs,
                         (Token *)((this->tokens->
                                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                   )._M_impl._M_node.super__List_node_base._M_next + 1));
            std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
            ::_M_erase(this->tokens,
                       (this->tokens->
                       super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                       )._M_impl._M_node.super__List_node_base._M_next);
            iVar8 = std::__cxx11::string::compare(local_2d8 + 0x10);
            if (iVar8 != 0) {
              pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
              obj = (AST *)local_218;
              local_218._0_5_ = 0x6973726170;
              local_218._5_3_ = 0x20676e;
              local_218._8_5_ = 0x6563696c73;
              pAStack_220 = (AST *)0xd;
              local_218[0xd] = 0;
              unexpected(pSVar11,(Parser *)&rhs,(Token *)&obj,psVar14);
              __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
            }
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(&third_fodder,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)local_2e0);
            if (*(int *)&(this->tokens->
                         super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                         )._M_impl._M_node.super__List_node_base._M_next[1]._M_next != 3) {
              third = parse(this,0xf);
            }
            if ((pointer)local_278._16_8_ != local_1e8._M_p) {
              operator_delete((void *)local_278._16_8_,local_278._32_8_ + 1);
            }
            if ((pointer)local_2d8._80_8_ != (pointer)local_278) {
              operator_delete((void *)local_2d8._80_8_,(ulong)(local_278._0_8_ + 1));
            }
            if ((undefined1 *)local_2d8._48_8_ != local_2d8 + 0x40) {
              operator_delete((void *)local_2d8._48_8_,local_2d8._64_8_ + 1);
            }
            if ((undefined1 *)local_2d8._16_8_ != local_2d8 + 0x20) {
              operator_delete((void *)local_2d8._16_8_,local_2d8._32_8_ + 1);
            }
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)local_2e0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.location.file._M_dataplus._M_p != local_3f0) {
            operator_delete(end.location.file._M_dataplus._M_p,
                            end.location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.stringBlockTermIndent._M_dataplus._M_p != &end.stringBlockTermIndent.field_2) {
            operator_delete(end.stringBlockTermIndent._M_dataplus._M_p,
                            end.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.stringBlockIndent._M_dataplus._M_p != &end.stringBlockIndent.field_2) {
            operator_delete(end.stringBlockIndent._M_dataplus._M_p,
                            end.stringBlockIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.data._M_dataplus._M_p != &end.data.field_2) {
            operator_delete(end.data._M_dataplus._M_p,end.data.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001a141e;
        }
        is_slice = false;
      }
      popExpect(&end,this,BRACKET_R,(char *)0x0);
      pAVar4 = this->alloc;
      pcVar5 = (local_3e0->location).file._M_dataplus._M_p;
      rhs = (AST *)local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rhs,pcVar5,pcVar5 + (local_3e0->location).file._M_string_length);
      local_2d8._16_8_ = local_3e8->line;
      local_2d8._24_8_ = local_3e8->column;
      local_2d8._32_8_ = local_3d8->line;
      local_2d8._40_8_ = local_3d8->column;
      lhs_local = &Allocator::
                   make<jsonnet::internal::Index,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                             (pAVar4,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,&is_slice
                              ,&first,&second_fodder,&second,&third_fodder,&third,&end.fodder)->
                   super_AST;
      if (rhs != (AST *)local_2d8) {
        operator_delete(rhs,CONCAT35(local_2d8._5_3_,local_2d8._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.location.file._M_dataplus._M_p != local_3f0) {
        operator_delete(end.location.file._M_dataplus._M_p,
                        end.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockTermIndent._M_dataplus._M_p != &end.stringBlockTermIndent.field_2) {
        operator_delete(end.stringBlockTermIndent._M_dataplus._M_p,
                        end.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockIndent._M_dataplus._M_p != &end.stringBlockIndent.field_2) {
        operator_delete(end.stringBlockIndent._M_dataplus._M_p,
                        end.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.data._M_dataplus._M_p != &end.data.field_2) {
        operator_delete(end.data._M_dataplus._M_p,end.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&end.fodder);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&third_fodder);
      this_00 = &second_fodder;
      goto LAB_001a15b2;
    case DOT:
      popExpect(&end,this,IDENTIFIER,(char *)0x0);
      pAVar4 = this->alloc;
      Token::data32_abi_cxx11_((UString *)&rhs,&end);
      pAVar10 = (AST *)Allocator::makeIdentifier(pAVar4,(UString *)&rhs);
      if (rhs != (AST *)local_2d8) {
        operator_delete(rhs,CONCAT35(local_2d8._5_3_,local_2d8._0_5_) * 4 + 4);
      }
      pAVar4 = this->alloc;
      pcVar5 = (local_3e0->location).file._M_dataplus._M_p;
      rhs = (AST *)local_2d8;
      obj = pAVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rhs,pcVar5,pcVar5 + (local_3e0->location).file._M_string_length);
      local_2d8._16_8_ = local_3e8->line;
      local_2d8._24_8_ = local_3e8->column;
      local_2d8._32_8_ = local_3d8->line;
      local_2d8._40_8_ = local_3d8->column;
      lhs_local = &Allocator::
                   make<jsonnet::internal::Index,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                             (pAVar4,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,
                              &end.fodder,(Identifier **)&obj)->super_AST;
      if (rhs != (AST *)local_2d8) {
        operator_delete(rhs,CONCAT35(local_2d8._5_3_,local_2d8._0_5_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.location.file._M_dataplus._M_p != local_3f0) {
        operator_delete(end.location.file._M_dataplus._M_p,
                        end.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockTermIndent._M_dataplus._M_p != &end.stringBlockTermIndent.field_2) {
        operator_delete(end.stringBlockTermIndent._M_dataplus._M_p,
                        end.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockIndent._M_dataplus._M_p != &end.stringBlockIndent.field_2) {
        operator_delete(end.stringBlockIndent._M_dataplus._M_p,
                        end.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.data._M_dataplus._M_p != &end.data.field_2) {
        operator_delete(end.data._M_dataplus._M_p,end.data.field_2._M_allocated_capacity + 1);
      }
LAB_001a0c43:
      this_00 = &end.fodder;
LAB_001a15b2:
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(this_00);
      break;
    case PAREN_L:
      obj = (AST *)0x0;
      pAStack_220 = (AST *)0x0;
      local_218._0_5_ = 0;
      local_218._5_3_ = 0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x11;
      rhs = (AST *)local_2d8;
      rhs = (AST *)std::__cxx11::string::_M_create((ulong *)&rhs,(ulong)&second_fodder);
      local_2d8._0_5_ =
           SUB85(second_fodder.
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 ._M_impl.super__Vector_impl_data._M_start,0);
      local_2d8._5_3_ =
           (undefined3)
           ((ulong)second_fodder.
                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 0x28);
      rhs->_vptr_AST = (_func_int **)0x6e6f6974636e7566;
      (rhs->location).file._M_dataplus._M_p = (pointer)0x6e656d7567726120;
      *(undefined1 *)&(rhs->location).file._M_string_length = 0x74;
      local_2e0 = (undefined1  [8])
                  second_fodder.
                  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      *(undefined1 *)
       ((long)&(second_fodder.
                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                ._M_impl.super__Vector_impl_data._M_start)->kind + (long)&rhs->_vptr_AST) = 0;
      parseArgs(&end,this,(ArgParams *)&obj,(string *)&rhs,(bool *)&third_fodder);
      if (rhs != (AST *)local_2d8) {
        operator_delete(rhs,CONCAT35(local_2d8._5_3_,local_2d8._0_5_) + 1);
      }
      if (obj != pAStack_220) {
        bVar12 = false;
        pAVar10 = obj;
        do {
          bVar7 = true;
          if (((pAVar10->location).file.field_2._M_allocated_capacity == 0) &&
             (bVar7 = bVar12, bVar12)) {
            pSVar11 = (StaticError *)__cxa_allocate_exception(0x60);
            uVar6 = (pAVar10->location).end.line;
            rhs = (AST *)local_2d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&rhs,"Positional argument after a named argument is not allowed",""
                      );
            StaticError::StaticError(pSVar11,(LocationRange *)(uVar6 + 8),(string *)&rhs);
            __cxa_throw(pSVar11,&StaticError::typeinfo,StaticError::~StaticError);
          }
          bVar12 = bVar7;
          pAVar10 = (AST *)&(pAVar10->openFodder).
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
        } while (pAVar10 != pAStack_220);
      }
      first = (AST *)((ulong)first & 0xffffffffffffff00);
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      second_fodder.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (*(int *)&(this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x1f) {
        Token::Token((Token *)&rhs,
                     (Token *)((this->tokens->
                               super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                               )._M_impl._M_node.super__List_node_base._M_next + 1));
        std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
        _M_erase(this->tokens,
                 (this->tokens->
                 super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                 )._M_impl._M_node.super__List_node_base._M_next);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(&second_fodder,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)local_2e0);
        first = (AST *)CONCAT71(first._1_7_,1);
        if ((pointer)local_278._16_8_ != local_1e8._M_p) {
          operator_delete((void *)local_278._16_8_,local_278._32_8_ + 1);
        }
        if ((pointer)local_2d8._80_8_ != (pointer)local_278) {
          operator_delete((void *)local_2d8._80_8_,(ulong)(local_278._0_8_ + 1));
        }
        if ((undefined1 *)local_2d8._48_8_ != local_2d8 + 0x40) {
          operator_delete((void *)local_2d8._48_8_,local_2d8._64_8_ + 1);
        }
        if ((undefined1 *)local_2d8._16_8_ != local_2d8 + 0x20) {
          operator_delete((void *)local_2d8._16_8_,local_2d8._32_8_ + 1);
        }
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)local_2e0);
      }
      pAVar4 = this->alloc;
      pcVar5 = (local_3e0->location).file._M_dataplus._M_p;
      rhs = (AST *)local_2d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rhs,pcVar5,pcVar5 + (local_3e0->location).file._M_string_length);
      local_2d8._16_8_ = local_3e8->line;
      local_2d8._24_8_ = local_3e8->column;
      local_2d8._32_8_ = local_3d8->line;
      local_2d8._40_8_ = local_3d8->column;
      lhs_local = &Allocator::
                   make<jsonnet::internal::Apply,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&>
                             (pAVar4,(LocationRange *)&rhs,
                              (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,
                              (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                               *)&obj,(bool *)&third_fodder,&end.fodder,&second_fodder,
                              (bool *)&first)->super_AST;
      if (rhs != (AST *)local_2d8) {
        operator_delete(rhs,CONCAT35(local_2d8._5_3_,local_2d8._0_5_) + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&second_fodder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.location.file._M_dataplus._M_p != local_3f0) {
        operator_delete(end.location.file._M_dataplus._M_p,
                        end.location.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockTermIndent._M_dataplus._M_p != &end.stringBlockTermIndent.field_2) {
        operator_delete(end.stringBlockTermIndent._M_dataplus._M_p,
                        end.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.stringBlockIndent._M_dataplus._M_p != &end.stringBlockIndent.field_2) {
        operator_delete(end.stringBlockIndent._M_dataplus._M_p,
                        end.stringBlockIndent.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)end.data._M_dataplus._M_p != &end.data.field_2) {
        operator_delete(end.data._M_dataplus._M_p,end.data.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector(&end.fodder);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              &obj);
      break;
    default:
      if (op.kind == OPERATOR) {
        pAVar10 = parse(this,max_precedence_00);
        pAVar4 = this->alloc;
        pcVar5 = (local_3e0->location).file._M_dataplus._M_p;
        end._0_8_ = ppFVar1;
        rhs = pAVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&end,pcVar5,pcVar5 + (local_3e0->location).file._M_string_length);
        end.data._M_dataplus._M_p = (pointer)local_3e8->line;
        end.data._M_string_length = local_3e8->column;
        end.data.field_2._M_allocated_capacity = (pAVar10->location).end.line;
        end.data.field_2._8_8_ = (pAVar10->location).end.column;
        lhs_local = &Allocator::
                     make<jsonnet::internal::Binary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::BinaryOp&,jsonnet::internal::AST*&>
                               (pAVar4,(LocationRange *)&end,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,&bop,
                                &rhs)->super_AST;
      }
      else {
        if (op.kind != IN) goto switchD_001a06a9_caseD_1;
        if (*(int *)&(this->tokens->
                     super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                     )._M_impl._M_node.super__List_node_base._M_next[1]._M_next == 0x22) {
          Token::Token(&end,(Token *)((this->tokens->
                                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                                      )._M_impl._M_node.super__List_node_base._M_next + 1));
          std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::
          _M_erase(this->tokens,
                   (this->tokens->
                   super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                   )._M_impl._M_node.super__List_node_base._M_next);
          pAVar4 = this->alloc;
          pcVar5 = (local_3e0->location).file._M_dataplus._M_p;
          rhs = (AST *)local_2d8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&rhs,pcVar5,pcVar5 + (local_3e0->location).file._M_string_length);
          local_2d8._16_8_ = local_3e8->line;
          local_2d8._24_8_ = local_3e8->column;
          local_2d8._32_8_ = local_3d8->line;
          local_2d8._40_8_ = local_3d8->column;
          lhs_local = &Allocator::
                       make<jsonnet::internal::InSuper,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                                 (pAVar4,(LocationRange *)&rhs,
                                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                   *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,
                                  &end.fodder)->super_AST;
          if (rhs != (AST *)local_2d8) {
            operator_delete(rhs,CONCAT35(local_2d8._5_3_,local_2d8._0_5_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.location.file._M_dataplus._M_p != local_3f0) {
            operator_delete(end.location.file._M_dataplus._M_p,
                            end.location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.stringBlockTermIndent._M_dataplus._M_p != &end.stringBlockTermIndent.field_2) {
            operator_delete(end.stringBlockTermIndent._M_dataplus._M_p,
                            end.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.stringBlockIndent._M_dataplus._M_p != &end.stringBlockIndent.field_2) {
            operator_delete(end.stringBlockIndent._M_dataplus._M_p,
                            end.stringBlockIndent.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)end.data._M_dataplus._M_p != &end.data.field_2) {
            operator_delete(end.data._M_dataplus._M_p,end.data.field_2._M_allocated_capacity + 1);
          }
          goto LAB_001a0c43;
        }
        pAVar10 = parse(this,max_precedence_00);
        pAVar4 = this->alloc;
        pcVar5 = (local_3e0->location).file._M_dataplus._M_p;
        end._0_8_ = ppFVar1;
        rhs = pAVar10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&end,pcVar5,pcVar5 + (local_3e0->location).file._M_string_length);
        end.data._M_dataplus._M_p = (pointer)local_3e8->line;
        end.data._M_string_length = local_3e8->column;
        end.data.field_2._M_allocated_capacity = (pAVar10->location).end.line;
        end.data.field_2._8_8_ = (pAVar10->location).end.column;
        lhs_local = &Allocator::
                     make<jsonnet::internal::Binary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::BinaryOp&,jsonnet::internal::AST*&>
                               (pAVar4,(LocationRange *)&end,
                                (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)(anonymous_namespace)::EMPTY_FODDER,&lhs_local,&op.fodder,&bop,
                                &rhs)->super_AST;
      }
      if ((pointer *)end._0_8_ != ppFVar1) {
        operator_delete((void *)end._0_8_,
                        (ulong)((long)&(end.fodder.
                                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->kind + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op.location.file._M_dataplus._M_p != &op.location.file.field_2) {
      operator_delete(op.location.file._M_dataplus._M_p,
                      op.location.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op.stringBlockTermIndent._M_dataplus._M_p != &op.stringBlockTermIndent.field_2) {
      operator_delete(op.stringBlockTermIndent._M_dataplus._M_p,
                      op.stringBlockTermIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op.stringBlockIndent._M_dataplus._M_p != &op.stringBlockIndent.field_2) {
      operator_delete(op.stringBlockIndent._M_dataplus._M_p,
                      op.stringBlockIndent.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)op.data._M_dataplus._M_p != &op.data.field_2) {
      operator_delete(op.data._M_dataplus._M_p,op.data.field_2._M_allocated_capacity + 1);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&op.fodder);
    bVar12 = true;
LAB_001a1652:
    if (!bVar12) {
      return (AST *)local_218._24_8_;
    }
  } while( true );
}

Assistant:

AST *parseInfix(AST *lhs, const Token &begin, unsigned max_precedence)
    {
        while (true) {

            BinaryOp bop = BOP_PLUS;
            unsigned op_precedence = 0;

            switch (peek().kind) {
                // Logical / arithmetic binary operator.
                case Token::IN:
                case Token::OPERATOR:
                    // These occur if the outer statement was an assert or array slice.
                    // Either way, we terminate the parsing here.
                    if (peek().data == ":" || peek().data == "::") {
                        return lhs;
                    }
                    if (!op_is_binary(peek().data, bop)) {
                        std::stringstream ss;
                        ss << "not a binary operator: " << peek().data;
                        throw StaticError(peek().location, ss.str());
                    }
                    op_precedence = precedence_map[bop];
                    break;

                // Index, Apply
                case Token::DOT:
                case Token::BRACKET_L:
                case Token::PAREN_L:
                case Token::BRACE_L:
                    op_precedence = APPLY_PRECEDENCE;
                    break;

                default:
                    // This happens when we reach EOF or the terminating token of an outer context.
                    return lhs;
            }

            // If higher precedence than the outer recursive call, let that handle it.
            if (op_precedence >= max_precedence)
                return lhs;

            Token op = pop();

            switch (op.kind) {
                case Token::BRACKET_L: {
                    bool is_slice;
                    AST *first = nullptr;
                    Fodder second_fodder;
                    AST *second = nullptr;
                    Fodder third_fodder;
                    AST *third = nullptr;

                    if (peek().kind == Token::BRACKET_R)
                        throw unexpected(pop(), "parsing index");

                    if (peek().data != ":" && peek().data != "::") {
                        first = parse(MAX_PRECEDENCE);
                    }

                    if (peek().kind == Token::OPERATOR && peek().data == "::") {
                        // Handle ::
                        is_slice = true;
                        Token joined = pop();
                        second_fodder = joined.fodder;

                        if (peek().kind != Token::BRACKET_R)
                            third = parse(MAX_PRECEDENCE);

                    } else if (peek().kind != Token::BRACKET_R) {
                        is_slice = true;
                        Token delim = pop();
                        if (delim.data != ":")
                            throw unexpected(delim, "parsing slice");

                        second_fodder = delim.fodder;

                        if (peek().data != ":" && peek().kind != Token::BRACKET_R)
                            second = parse(MAX_PRECEDENCE);

                        if (peek().kind != Token::BRACKET_R) {
                            Token delim = pop();
                            if (delim.data != ":")
                                throw unexpected(delim, "parsing slice");

                            third_fodder = delim.fodder;

                            if (peek().kind != Token::BRACKET_R)
                                third = parse(MAX_PRECEDENCE);
                        }
                    } else {
                        is_slice = false;
                    }
                    Token end = popExpect(Token::BRACKET_R);
                    lhs = alloc->make<Index>(span(begin, end),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             is_slice,
                                             first,
                                             second_fodder,
                                             second,
                                             third_fodder,
                                             third,
                                             end.fodder);
                    break;
                }
                case Token::DOT: {
                    Token field_id = popExpect(Token::IDENTIFIER);
                    const Identifier *id = alloc->makeIdentifier(field_id.data32());
                    lhs = alloc->make<Index>(span(begin, field_id),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             field_id.fodder,
                                             id);
                    break;
                }
                case Token::PAREN_L: {
                    ArgParams args;
                    bool got_comma;
                    Token end = parseArgs(args, "function argument", got_comma);
                    bool got_named = false;
                    for (const auto& arg : args) {
                        if (arg.id != nullptr) {
                            got_named = true;
                        } else {
                            if (got_named) {
                                throw StaticError(arg.expr->location, "Positional argument after a named argument is not allowed");
                            }
                        }
                    }
                    bool tailstrict = false;
                    Fodder tailstrict_fodder;
                    if (peek().kind == Token::TAILSTRICT) {
                        Token tailstrict_token = pop();
                        tailstrict_fodder = tailstrict_token.fodder;
                        tailstrict = true;
                    }
                    lhs = alloc->make<Apply>(span(begin, end),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             args,
                                             got_comma,
                                             end.fodder,
                                             tailstrict_fodder,
                                             tailstrict);
                    break;
                }
                case Token::BRACE_L: {
                    AST *obj;
                    Token end = parseObjectRemainder(obj, op);
                    lhs = alloc->make<ApplyBrace>(span(begin, end), EMPTY_FODDER, lhs, obj);
                    break;
                }

                case Token::IN: {
                    if (peek().kind == Token::SUPER) {
                        Token super = pop();
                        lhs = alloc->make<InSuper>(
                            span(begin, super), EMPTY_FODDER, lhs, op.fodder, super.fodder);
                    } else {
                        AST *rhs = parse(op_precedence);
                        lhs = alloc->make<Binary>(
                            span(begin, rhs), EMPTY_FODDER, lhs, op.fodder, bop, rhs);
                    }
                    break;
                }

                case Token::OPERATOR: {
                    AST *rhs = parse(op_precedence);
                    lhs = alloc->make<Binary>(
                        span(begin, rhs), EMPTY_FODDER, lhs, op.fodder, bop, rhs);
                    break;
                }

                default: {
                    std::cerr << "Should not be here." << std::endl;
                    abort();
                }
            }
        }

        // (1 & ((1 + (1 * 1)) + 1)) & 1
        //
        //

/*
        // Allocate this on the heap to control stack growth.
        std::unique_ptr<Token> begin_(new Token(peek()));
        const Token &begin = *begin_;
*/
    }